

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int pagerWalFrames(Pager *pPager,PgHdr *pList,Pgno nTruncate,int isCommit)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  Wal *pWal;
  u32 *puVar4;
  Pager *pPVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  uint *p;
  PgHdr **ppPVar11;
  long lVar12;
  sqlite3_int64 sVar13;
  Pgno nTruncate_00;
  PgHdr *pPVar14;
  long lVar15;
  long lVar16;
  PgHdr *pPVar17;
  long lVar18;
  u32 uVar19;
  ulong local_d0;
  PgHdr *local_c0;
  long local_a8;
  PgHdr *pList_local;
  u32 salt1;
  uint local_90;
  uint local_8c;
  undefined8 local_88;
  uint local_80;
  uint local_7c;
  sqlite3_file *local_70;
  uint *local_68;
  Pager *local_60;
  WalWriter w;
  u32 aCksum [2];
  
  pList_local = pList;
  if (isCommit == 0) {
    iVar6 = 1;
  }
  else {
    ppPVar11 = &pList_local;
    iVar6 = 0;
    for (; *ppPVar11 = pList, pList != (PgHdr *)0x0; pList = pList->pDirty) {
      if (pList->pgno <= nTruncate) {
        ppPVar11 = &pList->pDirty;
      }
      iVar6 = iVar6 + (uint)(pList->pgno <= nTruncate);
    }
  }
  pPVar14 = pList_local;
  pPager->aStat[2] = pPager->aStat[2] + iVar6;
  if (pList_local->pgno == 1) {
    pager_write_changecounter(pList_local);
  }
  pWal = pPager->pWal;
  uVar2 = pPager->pageSize;
  bVar1 = pPager->walSyncFlags;
  uVar7 = (uint)bVar1;
  puVar4 = *pWal->apWiData;
  iVar6 = bcmp(&pWal->hdr,puVar4,0x30);
  if (iVar6 == 0) {
    uVar8 = 0;
  }
  else {
    uVar8 = puVar4[4] + 1;
  }
  local_60 = pPager;
  if (pWal->readLock == 0) {
    if (puVar4[0x18] == 0) {
LAB_0011e671:
      walUnlockShared(pWal,3);
      pWal->readLock = -1;
      iVar10 = 1;
      do {
        iVar6 = walTryBeginRead(pWal,(int *)&salt1,1,iVar10);
        iVar10 = iVar10 + 1;
      } while (iVar6 == -1);
    }
    else {
      sqlite3_randomness(4,&salt1);
      iVar6 = walLockExclusive(pWal,4,4);
      if (iVar6 == 5) goto LAB_0011e671;
      if (iVar6 == 0) {
        walRestartHdr(pWal,salt1);
        walUnlockExclusive(pWal,4,4);
        goto LAB_0011e671;
      }
    }
    if (iVar6 != 0) {
      return iVar6;
    }
  }
  local_d0 = (ulong)(pWal->hdr).mxFrame;
  if (local_d0 == 0) {
    _salt1 = 0x18e22d0082067f37;
    local_90 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
    uVar9 = pWal->nCkpt;
    local_8c = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
    if (uVar9 == 0) {
      sqlite3_randomness(8,(pWal->hdr).aSalt);
    }
    local_88 = *(undefined8 *)(pWal->hdr).aSalt;
    walChecksumBytes(1,(u8 *)&salt1,0x18,(u32 *)0x0,aCksum);
    local_80 = aCksum[0] >> 0x18 | (aCksum[0] & 0xff0000) >> 8 | (aCksum[0] & 0xff00) << 8 |
               aCksum[0] << 0x18;
    local_7c = aCksum[1] >> 0x18 | (aCksum[1] & 0xff0000) >> 8 | (aCksum[1] & 0xff00) << 8 |
               aCksum[1] << 0x18;
    pWal->szPage = uVar2;
    (pWal->hdr).bigEndCksum = '\0';
    (pWal->hdr).aFrameCksum[0] = aCksum[0];
    (pWal->hdr).aFrameCksum[1] = aCksum[1];
    pWal->truncateOnCommit = '\x01';
    iVar6 = (*pWal->pWalFd->pMethods->xWrite)(pWal->pWalFd,&salt1,0x20,0);
    if (iVar6 != 0) {
      return iVar6;
    }
    if (((uVar7 != 0) && (pWal->syncHeader != '\0')) &&
       (iVar6 = (*pWal->pWalFd->pMethods->xSync)(pWal->pWalFd,uVar7 & 0x13), iVar6 != 0)) {
      return iVar6;
    }
  }
  local_70 = pWal->pWalFd;
  w.iSyncPoint = 0;
  lVar12 = (long)(int)uVar2 + 0x18;
  lVar16 = local_d0 * lVar12 + 0x20;
  local_c0 = (PgHdr *)0x0;
  w.pWal = pWal;
  w.pFd = local_70;
  w.syncFlags = uVar7;
  w.szPage = uVar2;
  for (pPVar17 = pPVar14; uVar9 = (uint)local_d0, pPVar17 != (PgHdr *)0x0; pPVar17 = pPVar17->pDirty
      ) {
    if (uVar8 == 0) {
LAB_0011e596:
      if (isCommit == 0) {
        nTruncate_00 = 0;
      }
      else {
        nTruncate_00 = 0;
        if (pPVar17->pDirty == (PgHdr *)0x0) {
          nTruncate_00 = nTruncate;
        }
      }
LAB_0011e5af:
      iVar6 = walWriteOneFrame(&w,pPVar17,nTruncate_00,lVar16);
      if (iVar6 != 0) {
        return iVar6;
      }
      local_d0 = (ulong)(uVar9 + 1);
      lVar16 = lVar16 + lVar12;
      *(byte *)&pPVar17->flags = (byte)pPVar17->flags | 0x40;
      local_c0 = pPVar17;
    }
    else {
      if ((isCommit != 0) && (nTruncate_00 = nTruncate, pPVar17->pDirty == (PgHdr *)0x0))
      goto LAB_0011e5af;
      _salt1 = _salt1 & 0xffffffff00000000;
      sqlite3WalFindFrame(pWal,pPVar17->pgno,&salt1);
      if (salt1 < uVar8) goto LAB_0011e596;
      if (salt1 <= pWal->iReCksum - 1) {
        pWal->iReCksum = salt1;
      }
      iVar6 = (*pWal->pWalFd->pMethods->xWrite)
                        (pWal->pWalFd,pPVar17->pData,uVar2,(ulong)(salt1 - 1) * lVar12 + 0x38);
      if (iVar6 != 0) {
        return iVar6;
      }
      *(byte *)&pPVar17->flags = (byte)pPVar17->flags & 0xbf;
    }
  }
  if (isCommit == 0) {
    iVar6 = 0;
    iVar10 = 0;
    goto LAB_0011e9ed;
  }
  if (pWal->iReCksum != 0) {
    local_a8 = (long)(int)pWal->szPage + 0x18;
    iVar6 = (int)local_a8;
    p = (uint *)sqlite3_malloc(iVar6);
    if (p == (uint *)0x0) {
      return 7;
    }
    if (pWal->iReCksum == 1) {
      sVar13 = 0x18;
    }
    else {
      local_a8 = (long)iVar6;
      sVar13 = (ulong)(pWal->iReCksum - 2) * local_a8 + 0x30;
    }
    iVar10 = (*pWal->pWalFd->pMethods->xRead)(pWal->pWalFd,p,8,sVar13);
    uVar8 = *p;
    (pWal->hdr).aFrameCksum[0] =
         uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18;
    uVar8 = p[1];
    (pWal->hdr).aFrameCksum[1] =
         uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18;
    uVar19 = pWal->iReCksum;
    pWal->iReCksum = 0;
    local_68 = p + 6;
    for (; (iVar10 == 0 && (uVar19 <= uVar9)); uVar19 = uVar19 + 1) {
      lVar18 = (ulong)(uVar19 - 1) * local_a8 + 0x20;
      iVar10 = (*pWal->pWalFd->pMethods->xRead)(pWal->pWalFd,p,iVar6,lVar18);
      if (iVar10 == 0) {
        uVar8 = *p;
        uVar3 = p[1];
        walEncodeFrame(pWal,uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 |
                            uVar8 << 0x18,
                       uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                       uVar3 << 0x18,(u8 *)local_68,(u8 *)&salt1);
        iVar10 = (*pWal->pWalFd->pMethods->xWrite)(pWal->pWalFd,&salt1,0x18,lVar18);
      }
    }
    sqlite3_free(p);
    if (iVar10 != 0) {
      return iVar10;
    }
  }
  if ((bVar1 & 0x20) == 0) {
    iVar10 = 0;
    iVar6 = 0;
  }
  else {
    if (pWal->padToSectorBoundary == '\0') {
      iVar10 = 0;
    }
    else {
      uVar8 = sqlite3SectorSize(pWal->pWalFd);
      lVar15 = (ulong)uVar8 + lVar16 + -1;
      lVar15 = lVar15 - lVar15 % (long)(ulong)uVar8;
      iVar10 = 0;
      w.iSyncPoint = lVar15;
      for (lVar18 = lVar16; lVar18 < lVar15; lVar18 = lVar18 + lVar12) {
        iVar6 = walWriteOneFrame(&w,local_c0,nTruncate,lVar18);
        if (iVar6 != 0) {
          return iVar6;
        }
        iVar10 = iVar10 + 1;
      }
      if (lVar15 != lVar16) {
        iVar6 = 0;
        goto LAB_0011e9b6;
      }
    }
    iVar6 = (*local_70->pMethods->xSync)(local_70,uVar7 & 0x13);
  }
LAB_0011e9b6:
  if ((pWal->truncateOnCommit != '\0') && (lVar16 = pWal->mxWalSize, -1 < lVar16)) {
    lVar12 = (ulong)(uVar9 + iVar10) * lVar12 + 0x20;
    if (lVar12 <= lVar16) {
      lVar12 = lVar16;
    }
    walLimitSize(pWal,lVar12);
    pWal->truncateOnCommit = '\0';
  }
LAB_0011e9ed:
  uVar19 = (pWal->hdr).mxFrame;
  pPVar17 = pPVar14;
  while ((pPVar17 != (PgHdr *)0x0 && (iVar6 == 0))) {
    iVar6 = 0;
    if ((pPVar17->flags & 0x40) != 0) {
      uVar19 = uVar19 + 1;
      iVar6 = walIndexAppend(pWal,uVar19,pPVar17->pgno);
    }
    pPVar17 = pPVar17->pDirty;
  }
  for (; (iVar6 == 0 && (0 < iVar10)); iVar10 = iVar10 + -1) {
    uVar19 = uVar19 + 1;
    iVar6 = walIndexAppend(pWal,uVar19,local_c0->pgno);
  }
  if (iVar6 == 0) {
    (pWal->hdr).szPage = (ushort)(uVar2 >> 0x10) | (ushort)uVar2 & 0xff00;
    (pWal->hdr).mxFrame = uVar19;
    if (isCommit != 0) {
      puVar4 = &(pWal->hdr).iChange;
      *puVar4 = *puVar4 + 1;
      (pWal->hdr).nPage = nTruncate;
      walIndexWriteHdr(pWal);
      pWal->iCallback = uVar19;
    }
    pPVar5 = local_60;
    iVar6 = 0;
    if (local_60->pBackup != (sqlite3_backup *)0x0) {
      for (; pPVar14 != (PgHdr *)0x0; pPVar14 = pPVar14->pDirty) {
        sqlite3BackupUpdate(pPVar5->pBackup,pPVar14->pgno,(u8 *)pPVar14->pData);
      }
    }
  }
  return iVar6;
}

Assistant:

static int pagerWalFrames(
  Pager *pPager,                  /* Pager object */
  PgHdr *pList,                   /* List of frames to log */
  Pgno nTruncate,                 /* Database size after this commit */
  int isCommit                    /* True if this is a commit */
){
  int rc;                         /* Return code */
  int nList;                      /* Number of pages in pList */
  PgHdr *p;                       /* For looping over pages */

  assert( pPager->pWal );
  assert( pList );
#ifdef SQLITE_DEBUG
  /* Verify that the page list is in accending order */
  for(p=pList; p && p->pDirty; p=p->pDirty){
    assert( p->pgno < p->pDirty->pgno );
  }
#endif

  assert( pList->pDirty==0 || isCommit );
  if( isCommit ){
    /* If a WAL transaction is being committed, there is no point in writing
    ** any pages with page numbers greater than nTruncate into the WAL file.
    ** They will never be read by any client. So remove them from the pDirty
    ** list here. */
    PgHdr **ppNext = &pList;
    nList = 0;
    for(p=pList; (*ppNext = p)!=0; p=p->pDirty){
      if( p->pgno<=nTruncate ){
        ppNext = &p->pDirty;
        nList++;
      }
    }
    assert( pList );
  }else{
    nList = 1;
  }
  pPager->aStat[PAGER_STAT_WRITE] += nList;

  if( pList->pgno==1 ) pager_write_changecounter(pList);
  rc = sqlite3WalFrames(pPager->pWal, 
      pPager->pageSize, pList, nTruncate, isCommit, pPager->walSyncFlags
  );
  if( rc==SQLITE_OK && pPager->pBackup ){
    for(p=pList; p; p=p->pDirty){
      sqlite3BackupUpdate(pPager->pBackup, p->pgno, (u8 *)p->pData);
    }
  }

#ifdef SQLITE_CHECK_PAGES
  pList = sqlite3PcacheDirtyList(pPager->pPCache);
  for(p=pList; p; p=p->pDirty){
    pager_set_pagehash(p);
  }
#endif

  return rc;
}